

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.cxx
# Opt level: O3

bool cmSetTestsPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  cmTest *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_type local_68;
  pointer local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_78._M_len = (size_t)&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[11]>>
                      (pbVar1,pbVar2,"PROPERTIES");
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((_Var3._M_current == pbVar5) || (local_58 = _Var3._M_current + 1, local_58 == pbVar5)) {
      local_78._M_len = (size_t)&local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,
                 "called with illegal arguments, maybe missing a PROPERTIES specifier?","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (((long)pbVar5 - (long)_Var3._M_current >> 5 & 0x8000000000000001U) == 1) {
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar5 == _Var3._M_current) {
          return true;
        }
        while (this = cmMakefile::GetTest(status->Makefile,pbVar5), this != (cmTest *)0x0) {
          pbVar4 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          prop = local_58;
          if (local_58 != pbVar4) {
            do {
              if (prop->_M_string_length != 0) {
                cmTest::SetProperty(this,prop,prop + 1);
                pbVar4 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              }
              prop = prop + 2;
            } while (prop != pbVar4);
          }
          pbVar5 = pbVar5 + 1;
          if (pbVar5 == _Var3._M_current) {
            return true;
          }
        }
        local_60 = (pbVar5->_M_dataplus)._M_p;
        local_68 = pbVar5->_M_string_length;
        local_78._M_len = (size_t)&DAT_00000028;
        local_78._M_str = "Can not find test to add properties to: ";
        views._M_len = 2;
        views._M_array = &local_78;
        cmCatViews_abi_cxx11_(&local_50,views);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return false;
        }
        goto LAB_0023ca14;
      }
      local_78._M_len = (size_t)&local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"called with incorrect number of arguments.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  local_50.field_2._M_allocated_capacity = local_68;
  local_50._M_dataplus._M_p = (pointer)local_78._M_len;
  if ((size_type *)local_78._M_len == &local_68) {
    return false;
  }
LAB_0023ca14:
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmSetTestsPropertiesCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // first identify the properties arguments
  auto propsIter = std::find(args.begin(), args.end(), "PROPERTIES");
  if (propsIter == args.end() || propsIter + 1 == args.end()) {
    status.SetError("called with illegal arguments, maybe missing a "
                    "PROPERTIES specifier?");
    return false;
  }

  if (std::distance(propsIter, args.end()) % 2 != 1) {
    status.SetError("called with incorrect number of arguments.");
    return false;
  }

  // loop over all the tests
  for (const std::string& tname : cmStringRange{ args.begin(), propsIter }) {
    if (cmTest* test = status.GetMakefile().GetTest(tname)) {
      // loop through all the props and set them
      for (auto k = propsIter + 1; k != args.end(); k += 2) {
        if (!k->empty()) {
          test->SetProperty(*k, *(k + 1));
        }
      }
    } else {
      status.SetError(
        cmStrCat("Can not find test to add properties to: ", tname));
      return false;
    }
  }
  return true;
}